

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest_NoParent_Test::TestBody
          (DiskSourceTreeTest_NoParent_Test *this)

{
  _func_int **pp_Var1;
  pointer pbVar2;
  Nonnull<const_char_*> failure_msg;
  char *contents;
  char *contents_00;
  string_view disk_path;
  undefined1 local_b0 [32];
  pointer local_90;
  pointer local_88;
  undefined1 local_80 [32];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  LogMessageFatal local_30;
  
  pbVar2 = (this->super_DiskSourceTreeTest).dirnames_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (pointer)(pbVar2->_M_dataplus)._M_p;
  local_90 = (pointer)pbVar2->_M_string_length;
  local_60._0_8_ = &DAT_00000004;
  local_60._8_8_ = "/foo";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_b0,(lts_20250127 *)&local_90,(AlphaNum *)local_60,(AlphaNum *)local_88)
  ;
  DiskSourceTreeTest::AddFile((DiskSourceTreeTest *)local_b0,(string *)"Hello World!",contents);
  pp_Var1 = (_func_int **)(local_b0 + 0x10);
  if ((_func_int **)local_b0._0_8_ != pp_Var1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  pbVar2 = (this->super_DiskSourceTreeTest).dirnames_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (pointer)(pbVar2->_M_dataplus)._M_p;
  local_90 = (pointer)pbVar2->_M_string_length;
  local_60._0_8_ = &DAT_00000004;
  local_60._8_8_ = "/bar";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_b0,(lts_20250127 *)&local_90,(AlphaNum *)local_60,(AlphaNum *)local_88)
  ;
  File::CreateDir((File *)&local_30,(string *)local_b0,0x1ff);
  if ((StatusRep *)local_30.super_LogMessage._0_8_ == (StatusRep *)0x1) {
    if ((_func_int **)local_b0._0_8_ != pp_Var1) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    pbVar2 = (this->super_DiskSourceTreeTest).dirnames_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_88 = (pointer)(pbVar2->_M_dataplus)._M_p;
    local_90 = (pointer)pbVar2->_M_string_length;
    local_60._0_8_ = &DAT_00000008;
    local_60._8_8_ = "/bar/baz";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_b0,(lts_20250127 *)&local_90,(AlphaNum *)local_60,
               (AlphaNum *)local_88);
    DiskSourceTreeTest::AddFile((DiskSourceTreeTest *)local_b0,(string *)"Blah.",contents_00);
    if ((_func_int **)local_b0._0_8_ != pp_Var1) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    pbVar2 = (this->super_DiskSourceTreeTest).dirnames_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_88 = (pointer)(pbVar2->_M_dataplus)._M_p;
    local_90 = (pointer)pbVar2->_M_string_length;
    local_60._0_8_ = &DAT_00000004;
    local_60._8_8_ = "/bar";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_b0,(lts_20250127 *)&local_90,(AlphaNum *)local_60,
               (AlphaNum *)local_88);
    disk_path._M_str = (char *)local_b0._0_8_;
    disk_path._M_len = local_b0._8_8_;
    DiskSourceTree::MapPath
              (&(this->super_DiskSourceTreeTest).source_tree_,
               (string_view)(ZEXT816(0x10f75f1) << 0x40),disk_path);
    if ((_func_int **)local_b0._0_8_ != pp_Var1) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    local_90 = (pointer)local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"baz","");
    DiskSourceTreeTest::ExpectFileContents
              (&this->super_DiskSourceTreeTest,&local_90->virtual_path,(char *)local_88);
    if (local_90 != (pointer)local_80) {
      operator_delete(local_90,(ulong)(local_80._0_8_ + 1));
    }
    local_90 = (pointer)local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"../foo","");
    local_60._0_8_ = &local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,
               "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
               ,"");
    DiskSourceTreeTest::ExpectCannotOpenFile
              (&this->super_DiskSourceTreeTest,&local_90->virtual_path,&local_88->virtual_path);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_ !=
        &local_50) {
      operator_delete((void *)local_60._0_8_,(ulong)((long)local_50._M_dataplus._M_p + 1));
    }
    if (local_90 != (pointer)local_80) {
      operator_delete(local_90,(ulong)(local_80._0_8_ + 1));
    }
    local_90 = (pointer)local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"../bar/baz","");
    local_60._0_8_ = &local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,
               "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
               ,"");
    DiskSourceTreeTest::ExpectCannotOpenFile
              (&this->super_DiskSourceTreeTest,&local_90->virtual_path,&local_88->virtual_path);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_ !=
        &local_50) {
      operator_delete((void *)local_60._0_8_,(ulong)((long)local_50._M_dataplus._M_p + 1));
    }
    if (local_90 != (pointer)local_80) {
      operator_delete(local_90,(ulong)(local_80._0_8_ + 1));
    }
    return;
  }
  failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                          ((Nonnull<const_absl::Status_*>)&local_30,
                           "File::CreateDir(dirname, 0777) is OK");
  if ((local_30.super_LogMessage._0_8_ & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref
              ((StatusRep *)local_30.super_LogMessage._0_8_);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/importer_unittest.cc"
             ,0x10a,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

TEST_F(DiskSourceTreeTest, NoParent) {
  // Test that we cannot open files in a parent of a mapped directory.

  AddFile(absl::StrCat(dirnames_[0], "/foo"), "Hello World!");
  AddSubdir(absl::StrCat(dirnames_[0], "/bar"));
  AddFile(absl::StrCat(dirnames_[0], "/bar/baz"), "Blah.");
  source_tree_.MapPath("", absl::StrCat(dirnames_[0], "/bar"));

  ExpectFileContents("baz", "Blah.");
  ExpectCannotOpenFile("../foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("../bar/baz",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
}